

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O3

bool __thiscall ACTable::UpdateFDIs(ACTable *this,string *_filter)

{
  string *_s;
  vector<FDInfo,_std::allocator<FDInfo>_> *this_00;
  size_t __n;
  _Base_ptr p_Var1;
  long *plVar2;
  FDInfo *this_01;
  pointer pFVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  _Base_ptr p_Var7;
  vector<FDInfo,_std::allocator<FDInfo>_> *this_02;
  long lVar8;
  FDInfo *fdi_1;
  float _now;
  vector<FDInfo,_std::allocator<FDInfo>_> vecAgain;
  FDInfo fdi;
  vector<FDInfo,_std::allocator<FDInfo>_> local_5f8;
  FDInfo local_5e0;
  
  _now = DataRefs::GetMiscNetwTime(&dataRefs);
  bVar4 = CheckEverySoOften(&this->lastUpdate,1.0,_now);
  if ((((bVar4) || (__n = _filter->_M_string_length, __n != (this->filterInUse)._M_string_length))
      || ((__n != 0 &&
          (iVar5 = bcmp((_filter->_M_dataplus)._M_p,(this->filterInUse)._M_dataplus._M_p,__n),
          iVar5 != 0)))) || (this->bFilterAcOnly != this->bAcOnlyInUse)) {
    _s = &this->filterInUse;
    std::__cxx11::string::_M_assign((string *)_s);
    this->bAcOnlyInUse = this->bFilterAcOnly;
    this_00 = &this->vecFDI;
    std::vector<FDInfo,_std::allocator<FDInfo>_>::_M_erase_at_end
              (this_00,(this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if ((this->filterInUse)._M_string_length == 0) {
      std::vector<FDInfo,_std::allocator<FDInfo>_>::reserve
                (this_00,mapFd._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    iVar5 = dataRefs.hideStaticTwr;
    local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.super__Vector_impl_data.
    _M_start = (FDInfo *)0x0;
    local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.super__Vector_impl_data.
    _M_finish = (FDInfo *)0x0;
    local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((_Rb_tree_header *)mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &mapFd._M_t._M_impl.super__Rb_tree_header) {
      p_Var7 = mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if (((this->bFilterAcOnly != true) ||
            (((p_Var1 = p_Var7[0x1d]._M_left, p_Var1 != (_Base_ptr)0x0 &&
              (*(char *)((long)&p_Var1[0xf]._M_left + 1) == '\x01')) &&
             (((ulong)p_Var1[0xf]._M_left & 1) != 0)))) &&
           ((iVar5 == 0 ||
            (bVar4 = LTFlightData::FDStaticData::isStaticObject
                               ((FDStaticData *)&p_Var7[0x10]._M_right), !bVar4)))) {
          FDInfo::FDInfo(&local_5e0,(LTFlightData *)&p_Var7[2]._M_left);
          this_02 = &local_5f8;
          if ((local_5e0.bUpToDate != true) ||
             (bVar4 = FDInfo::matches(&local_5e0,_s), this_02 = this_00, bVar4)) {
            std::vector<FDInfo,_std::allocator<FDInfo>_>::emplace_back<FDInfo>(this_02,&local_5e0);
          }
          lVar8 = 0x500;
          do {
            plVar6 = (long *)((long)local_5e0.v._M_elems + lVar8 + -0x30);
            plVar2 = *(long **)((long)(local_5e0.v._M_elems + -2) + lVar8);
            if (plVar6 != plVar2) {
              operator_delete(plVar2,*plVar6 + 1);
            }
            lVar8 = lVar8 + -0x20;
          } while (lVar8 != 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0.key.key._M_dataplus._M_p != &local_5e0.key.key.field_2) {
            operator_delete(local_5e0.key.key._M_dataplus._M_p,
                            local_5e0.key.key.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        pFVar3 = local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        this_01 = local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while ((_Rb_tree_header *)p_Var7 != &mapFd._M_t._M_impl.super__Rb_tree_header);
      for (; this_01 != pFVar3; this_01 = this_01 + 1) {
        FDInfo::Update(this_01);
        bVar4 = FDInfo::matches(this_01,_s);
        if (bVar4) {
          std::vector<FDInfo,_std::allocator<FDInfo>_>::emplace_back<FDInfo>(this_00,this_01);
        }
      }
    }
    std::vector<FDInfo,_std::allocator<FDInfo>_>::~vector(&local_5f8);
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ACTable::UpdateFDIs (const std::string& _filter)
{
    // short-cut in case of no change
    if (!CheckEverySoOften(lastUpdate, ACT_AC_UPDATE_PERIOD) &&
        _filter == filterInUse &&
        bFilterAcOnly == bAcOnlyInUse)
        return false;
    filterInUse = _filter;
    bAcOnlyInUse = bFilterAcOnly;
    
    // Walk all aircraft, test for match, then add
    vecFDI.clear();
    if (filterInUse.empty())        // reserve storage (if no filter defined)
        vecFDI.reserve(mapFd.size());
    
    // First pass: Add all matching and remember those we couldn't get
    const bool bHideStatic = dataRefs.GetHideStaticTwr();
    std::vector<FDInfo> vecAgain;
    for (const mapLTFlightDataTy::value_type& p: mapFd) {
        // First filter: Visible a/c only?
        if (bFilterAcOnly && (!p.second.hasAc() || !p.second.GetAircraft()->IsVisible()))
            continue;
        // 2nd filter: Don't show static objects
        if (bHideStatic && p.second.GetUnsafeStat().isStaticObject())
            continue;
        // others: test if filter matches
        FDInfo fdi(p.second);
        if (fdi.upToDate()) {
            if (fdi.matches(filterInUse))
                vecFDI.emplace_back(std::move(fdi));
        } else {
            vecAgain.emplace_back(std::move(fdi));
        }
    }
    
    // Second pass: Try those again, which couldn't yet fully update
    for (FDInfo& fdi: vecAgain) {
        fdi.Update();
        if (fdi.matches(filterInUse))
            vecFDI.emplace_back(std::move(fdi));
    }
    
    // Did do an update
    return true;
}